

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cc
# Opt level: O2

string * __thiscall
draco::Options::GetString(string *__return_storage_ptr__,Options *this,string *name)

{
  allocator<char> local_41;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_41);
  GetString(__return_storage_ptr__,this,name,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string Options::GetString(const std::string &name) const {
  return GetString(name, "");
}